

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O2

int64_t av1_block_error_lp_avx2(int16_t *coeff,int16_t *dqcoeff,intptr_t block_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int i;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  if (block_size == 0x10) {
    auVar6 = vpsubw_avx2(*(undefined1 (*) [32])dqcoeff,*(undefined1 (*) [32])coeff);
    auVar6 = vpmaddwd_avx2(auVar6,auVar6);
    auVar6 = vphaddd_avx2(auVar6,auVar6);
    auVar6 = vpunpckldq_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  }
  else if (block_size == 0x20) {
    auVar6 = vpsubw_avx2(*(undefined1 (*) [32])dqcoeff,*(undefined1 (*) [32])coeff);
    auVar8 = vpsubw_avx2(*(undefined1 (*) [32])(dqcoeff + 0x10),*(undefined1 (*) [32])(coeff + 0x10)
                        );
    auVar6 = vpmaddwd_avx2(auVar6,auVar6);
    auVar8 = vpmaddwd_avx2(auVar8,auVar8);
    auVar6 = vpaddd_avx2(auVar8,auVar6);
    auVar8 = vpunpckldq_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar6 = vpunpckhdq_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar6 = vpaddq_avx2(auVar8,auVar6);
  }
  else {
    auVar7 = ZEXT1664((undefined1  [16])0x0);
    for (lVar5 = 0; auVar6 = auVar7._0_32_, lVar5 < block_size; lVar5 = lVar5 + 0x40) {
      auVar8 = vpsubw_avx2(*(undefined1 (*) [32])(dqcoeff + lVar5),
                           *(undefined1 (*) [32])(coeff + lVar5));
      auVar2 = vpsubw_avx2(*(undefined1 (*) [32])(dqcoeff + lVar5 + 0x10),
                           *(undefined1 (*) [32])(coeff + lVar5 + 0x10));
      auVar3 = vpsubw_avx2(*(undefined1 (*) [32])(dqcoeff + lVar5 + 0x20),
                           *(undefined1 (*) [32])(coeff + lVar5 + 0x20));
      auVar4 = vpsubw_avx2(*(undefined1 (*) [32])(dqcoeff + lVar5 + 0x30),
                           *(undefined1 (*) [32])(coeff + lVar5 + 0x30));
      auVar8 = vpmaddwd_avx2(auVar8,auVar8);
      auVar2 = vpmaddwd_avx2(auVar2,auVar2);
      auVar8 = vpaddd_avx2(auVar2,auVar8);
      auVar2 = vpmaddwd_avx2(auVar3,auVar3);
      auVar3 = vpmaddwd_avx2(auVar4,auVar4);
      auVar2 = vpaddd_avx2(auVar3,auVar2);
      auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar3 = vpunpckldq_avx2(auVar8,auVar9);
      auVar8 = vpunpckhdq_avx2(auVar8,auVar9);
      auVar4 = vpunpckldq_avx2(auVar2,auVar9);
      auVar8 = vpaddq_avx2(auVar8,auVar4);
      auVar2 = vpunpckhdq_avx2(auVar2,auVar9);
      auVar6 = vpaddq_avx2(auVar6,auVar3);
      auVar6 = vpaddq_avx2(auVar6,auVar8);
      auVar6 = vpaddq_avx2(auVar6,auVar2);
      auVar7 = ZEXT3264(auVar6);
    }
  }
  auVar8 = vpsrldq_avx2(auVar6,8);
  auVar6 = vpaddq_avx2(auVar6,auVar8);
  auVar1 = vpaddq_avx(auVar6._0_16_,auVar6._16_16_);
  return auVar1._0_8_;
}

Assistant:

int64_t av1_block_error_lp_avx2(const int16_t *coeff, const int16_t *dqcoeff,
                                intptr_t block_size) {
  assert(block_size % 16 == 0);
  __m256i sse_256 = _mm256_setzero_si256();
  int64_t sse;

  if (block_size == 16)
    av1_block_error_block_size16_avx2(coeff, dqcoeff, &sse_256);
  else if (block_size == 32)
    av1_block_error_block_size32_avx2(coeff, dqcoeff, &sse_256);
  else
    av1_block_error_block_size64_avx2(coeff, dqcoeff, &sse_256, block_size);

  // Save the higher 64 bit of each 128 bit lane.
  const __m256i sse_hi = _mm256_srli_si256(sse_256, 8);
  // Add the higher 64 bit to the low 64 bit.
  sse_256 = _mm256_add_epi64(sse_256, sse_hi);
  // Accumulate the sse_256 register to get final sse
  const __m128i sse_128 = _mm_add_epi64(_mm256_castsi256_si128(sse_256),
                                        _mm256_extractf128_si256(sse_256, 1));

  // Store the results.
  _mm_storel_epi64((__m128i *)&sse, sse_128);
  return sse;
}